

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_rust_punycode.cc
# Opt level: O1

Nullable<char_*> absl::debugging_internal::DecodeRustPunycode(DecodeRustPunycodeOptions options)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  uint32_t uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 *__src;
  uint uVar8;
  long lVar9;
  size_t __n;
  size_t sVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint32_t index;
  ulong uVar15;
  char *pcVar16;
  ulong uVar17;
  bool bVar18;
  char *in_stack_00000008;
  char *in_stack_00000010;
  undefined1 *in_stack_00000018;
  Utf8ForCodePoint utf8_for_code_point;
  BoundedUtf8LengthSequence<256U> utf8_lengths;
  ulong local_a0;
  Utf8ForCodePoint local_98;
  ulong local_90;
  undefined1 *local_88;
  ulong local_80;
  BoundedUtf8LengthSequence<256U> local_78;
  
  local_80 = (long)utf8_for_code_point - (long)in_stack_00000018;
  if (local_80 == 0) {
    return (Nullable<char_*>)0x0;
  }
  *in_stack_00000018 = 0;
  uVar6 = (long)in_stack_00000010 - (long)in_stack_00000008;
  bVar3 = 0 < (long)uVar6;
  __n = 0xffffffff;
  if (0 < (long)uVar6) {
    uVar7 = 0;
    do {
      bVar1 = in_stack_00000008[uVar7];
      if (bVar1 == 0x5f) {
        bVar18 = true;
        __n = uVar7 & 0xffffffff;
      }
      else {
        bVar18 = true;
        if (0x19 < (byte)((bVar1 & 0xdf) + 0xbf)) {
          bVar18 = (byte)(bVar1 - 0x30) < 10;
        }
      }
      if (!bVar18) break;
      uVar7 = uVar7 + 1;
      bVar3 = (long)uVar7 < (long)uVar6;
    } while (uVar6 != uVar7);
  }
  local_88 = in_stack_00000018;
  if (!bVar3) {
    bVar3 = true;
    iVar5 = (int)__n;
    if (iVar5 < 0) {
      uVar6 = 0;
      goto LAB_00313de4;
    }
    if ((iVar5 != 0) && ((long)(ulong)(iVar5 + 1) <= (long)local_80)) {
      sVar10 = __n;
      memcpy(in_stack_00000018,in_stack_00000008,__n);
      in_stack_00000018[__n] = 0;
      in_stack_00000008 = in_stack_00000008 + (iVar5 + 1);
      uVar6 = __n;
      __n = sVar10;
      goto LAB_00313de4;
    }
  }
  bVar3 = false;
  uVar6 = 0;
LAB_00313de4:
  if (!bVar3) {
    return (Nullable<char_*>)0x0;
  }
  local_78.rep_[6] = 0;
  local_78.rep_[7] = 0;
  local_78.rep_[4] = 0;
  local_78.rep_[5] = 0;
  local_78.rep_[2] = 0;
  local_78.rep_[3] = 0;
  local_78.rep_[0] = 0;
  local_78.rep_[1] = 0;
  iVar5 = 0x48;
  uVar14 = 0x80;
  index = 0;
  local_a0 = uVar6;
LAB_00313e1e:
  if (in_stack_00000008 == in_stack_00000010) {
    return local_88 + local_a0;
  }
  if (0xff < (uint)uVar6) {
    return (Nullable<char_*>)0x0;
  }
  uVar8 = 0x24;
  lVar9 = 1;
  uVar15 = (ulong)index;
  uVar7 = (ulong)index;
LAB_00313e5a:
  cVar2 = *in_stack_00000008;
  iVar12 = (int)cVar2;
  if ((byte)(cVar2 - 0x30U) < 10) {
    uVar13 = iVar12 - 0x16;
  }
  else if ((byte)(cVar2 + 0x9fU) < 0x1a) {
    uVar13 = iVar12 - 0x61;
  }
  else {
    uVar13 = iVar12 - 0x41;
    if (0x19 < (byte)(cVar2 + 0xbfU)) {
      uVar13 = 0xffffffff;
    }
  }
  if (((int)uVar13 < 0) || (uVar17 = (ulong)uVar13 * lVar9 + uVar7, 0x40000000 < uVar17)) {
    bVar3 = false;
    __n = 0;
  }
  else {
    uVar11 = uVar8 - iVar5;
    if (iVar5 + 0x1aU <= uVar8) {
      uVar11 = 0x1a;
    }
    if (uVar8 <= iVar5 + 1U) {
      uVar11 = 1;
    }
    bVar18 = uVar13 < uVar11;
    bVar3 = !bVar18;
    uVar13 = 0x24 - uVar11;
    if (bVar18) {
      uVar13 = 1;
    }
    lVar9 = lVar9 * (ulong)uVar13;
    __n = (size_t)(byte)(bVar18 | (byte)__n);
    uVar15 = uVar17 & 0xffffffff;
    uVar7 = uVar17 & 0xffffffff;
  }
  in_stack_00000008 = in_stack_00000008 + 1;
  if (bVar3) goto code_r0x00313f04;
  iVar12 = 0;
  pcVar16 = in_stack_00000008;
  if ((__n & 1) != 0) {
    uVar7 = 2;
    if (index == 0) {
      uVar7 = 700;
    }
    uVar7 = ((uint32_t)uVar15 - index) / uVar7;
    uVar13 = (uint)uVar6 + 1;
    uVar8 = (int)(uVar7 / uVar13) + (int)uVar7;
    if (0x1c7 < uVar8) {
      iVar12 = 0;
      uVar11 = uVar8;
      do {
        uVar8 = uVar11 / 0x23;
        iVar12 = iVar12 + 0x24;
        bVar3 = 0x3e57 < uVar11;
        uVar11 = uVar8;
      } while (bVar3);
    }
    local_90 = (ulong)(uVar8 * 0x24) / (ulong)(uVar8 + 0x26);
    index = (uint32_t)(uVar15 % (ulong)uVar13);
    uVar14 = (int)(uVar15 / uVar13) + uVar14;
    Utf8ForCodePoint::Utf8ForCodePoint(&local_98,(ulong)uVar14);
    if ((local_98.length == 0) || (local_80 < (int)local_a0 + local_98.length + 1)) {
      bVar3 = false;
    }
    else {
      uVar4 = BoundedUtf8LengthSequence<256U>::InsertAndReturnSumOfPredecessors
                        (&local_78,index,local_98.length);
      __src = local_88 + uVar4;
      memmove(__src + local_98.length,__src,(ulong)(((int)local_a0 - uVar4) + 1));
      memcpy(__src,&local_98,(ulong)local_98.length);
      local_a0 = (ulong)((int)local_a0 + local_98.length);
      index = index + 1;
      bVar3 = true;
      uVar6 = (ulong)uVar13;
    }
    iVar5 = (int)local_90 + iVar12;
    goto LAB_00314057;
  }
  goto LAB_00313f7d;
code_r0x00313f04:
  uVar8 = uVar8 + 0x24;
  pcVar16 = in_stack_00000010;
  if (in_stack_00000008 == in_stack_00000010) goto LAB_00313f7d;
  goto LAB_00313e5a;
LAB_00313f7d:
  bVar3 = false;
  in_stack_00000008 = pcVar16;
  index = (uint32_t)uVar15;
LAB_00314057:
  if (!bVar3) {
    return (Nullable<char_*>)0x0;
  }
  goto LAB_00313e1e;
}

Assistant:

absl::Nullable<char*> DecodeRustPunycode(DecodeRustPunycodeOptions options) {
  const char* punycode_begin = options.punycode_begin;
  const char* const punycode_end = options.punycode_end;
  char* const out_begin = options.out_begin;
  char* const out_end = options.out_end;

  // Write a NUL terminator first.  Later memcpy calls will keep bumping it
  // along to its new right place.
  const size_t out_size = static_cast<size_t>(out_end - out_begin);
  if (out_size == 0) return nullptr;
  *out_begin = '\0';

  // RFC 3492 section 6.2 begins here.  We retain the names of integer variables
  // appearing in that text.
  uint32_t n = 128, i = 0, bias = 72, num_chars = 0;

  // If there are any ASCII characters, consume them and their trailing
  // underscore delimiter.
  if (!ConsumeOptionalAsciiPrefix(punycode_begin, punycode_end,
                                  out_begin, out_end, num_chars)) {
    return nullptr;
  }
  uint32_t total_utf8_bytes = num_chars;

  BoundedUtf8LengthSequence<kMaxChars> utf8_lengths;

  // "while the input is not exhausted do begin ... end"
  while (punycode_begin != punycode_end) {
    if (num_chars >= kMaxChars) return nullptr;

    const uint32_t old_i = i;

    if (!ScanNextDelta(punycode_begin, punycode_end, bias, i)) return nullptr;

    // Update bias as in RFC 3492 section 6.1.  (We have inlined adapt.)
    uint32_t delta = i - old_i;
    delta /= (old_i == 0 ? kDamp : 2);
    delta += delta/(num_chars + 1);
    bias = 0;
    while (delta > ((kBase - kTMin) * kTMax)/2) {
      delta /= kBase - kTMin;
      bias += kBase;
    }
    bias += ((kBase - kTMin + 1) * delta)/(delta + kSkew);

    // Back in section 6.2, compute the new code point and insertion index.
    static_assert(
        kMaxI + kMaxCodePoint < (uint64_t{1} << 32),
        "Make kMaxI smaller or n 64 bits wide to prevent silent wraparound");
    n += i/(num_chars + 1);
    i %= num_chars + 1;

    // To actually insert, we need to convert the code point n to UTF-8 and the
    // character index i to an index into the byte stream emitted so far.  First
    // prepare the UTF-8 encoding for n, rejecting surrogates, overlarge values,
    // and anything that won't fit into the remaining output storage.
    Utf8ForCodePoint utf8_for_code_point(n);
    if (!utf8_for_code_point.ok()) return nullptr;
    if (total_utf8_bytes + utf8_for_code_point.length + 1 > out_size) {
      return nullptr;
    }

    // Now insert the new character into both our length map and the output.
    uint32_t n_index =
        utf8_lengths.InsertAndReturnSumOfPredecessors(
            i, utf8_for_code_point.length);
    std::memmove(
        out_begin + n_index + utf8_for_code_point.length, out_begin + n_index,
        total_utf8_bytes + 1 - n_index);
    std::memcpy(out_begin + n_index, utf8_for_code_point.bytes,
                utf8_for_code_point.length);
    total_utf8_bytes += utf8_for_code_point.length;
    ++num_chars;

    // Finally, advance to the next state before continuing.
    ++i;
  }

  return out_begin + total_utf8_bytes;
}